

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tran_test.c
# Opt level: O0

void udp_recv_count_cb(void *arg)

{
  nng_err num;
  nng_msg *msg;
  size_t sVar1;
  char *pcVar2;
  int rv;
  nng_msg *m;
  udp_recv_count *c;
  void *arg_local;
  
  num = nng_aio_result(*arg);
  if (num == NNG_OK) {
    msg = nng_aio_get_msg(*arg);
    nng_aio_set_msg(*arg,(nng_msg *)0x0);
    sVar1 = nng_msg_len(msg);
    if (sVar1 == *(size_t *)((long)arg + 0x18)) {
      *(int *)((long)arg + 8) = *(int *)((long)arg + 8) + 1;
    }
    else {
      *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + 1;
    }
    nng_msg_free(msg);
  }
  else if (num == NNG_ETIMEDOUT) {
    *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + 1;
  }
  else {
    if (((num == NNG_ECLOSED) || (num == NNG_ECANCELED)) || (num == NNG_ESTOPPED)) {
      *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + 1;
      return;
    }
    *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + 1;
    pcVar2 = nng_strerror(num);
    nng_log_warn((char *)0x0,"Unexpected recv error %s",pcVar2);
  }
  nng_aio_set_timeout(*arg,1000);
  nng_socket_recv((nng_socket)*(uint32_t *)((long)arg + 0x20),*arg);
  return;
}

Assistant:

void
udp_recv_count_cb(void *arg)
{
	udp_recv_count *c = arg;
	nng_msg        *m;
	int             rv;

	rv = nng_aio_result(c->aio);
	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ECANCELED:
	case NNG_ESTOPPED:
		c->fail++;
		return;
	case NNG_ETIMEDOUT:
		c->fail++;
		break;
	case 0:
		m = nng_aio_get_msg(c->aio);
		nng_aio_set_msg(c->aio, NULL);
		if (nng_msg_len(m) != c->len) {
			c->fail++;
		} else {
			c->pass++;
		}
		nng_msg_free(m);
		break;
	default:
		c->fail++;
		nng_log_warn(
		    NULL, "Unexpected recv error %s", nng_strerror(rv));
		break;
	}

	nng_aio_set_timeout(c->aio, 1000);
	nng_socket_recv(c->sock, c->aio);
}